

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

Twine * llvm::operator+(Twine *__return_storage_ptr__,Twine *LHS,Twine *RHS)

{
  Twine *RHS_local;
  Twine *LHS_local;
  
  Twine::concat(__return_storage_ptr__,LHS,RHS);
  return __return_storage_ptr__;
}

Assistant:

inline Twine operator+(const Twine &LHS, const Twine &RHS) {
    return LHS.concat(RHS);
  }